

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPU4StateImpl.hpp
# Opt level: O1

int __thiscall
beagle::cpu::BeagleCPU4StateImpl<double,_1,_0>::calcRootLogLikelihoodsMulti
          (BeagleCPU4StateImpl<double,_1,_0> *this,int *bufferIndices,int *categoryWeightsIndices,
          int *stateFrequenciesIndices,int *scaleBufferIndices,int count,double *outSumLogLikelihood
          )

{
  double dVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  double *pdVar10;
  double *pdVar11;
  double **ppdVar12;
  uint uVar13;
  double *pdVar14;
  int iVar15;
  int iVar16;
  ulong uVar17;
  int iVar18;
  long lVar19;
  int iVar20;
  int *piVar21;
  long lVar22;
  long lVar23;
  ulong uVar24;
  ulong uVar25;
  double dVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [64];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  vector<double,_std::allocator<double>_> maxScaleFactor;
  vector<int,_std::allocator<int>_> indexMaxScale;
  allocator_type local_b9;
  int *local_b8;
  double *local_b0;
  double local_a8;
  ulong local_a0;
  int *local_98;
  int *local_90;
  long local_88;
  ulong local_80;
  double local_78;
  double local_70;
  double local_68;
  vector<double,_std::allocator<double>_> local_60;
  vector<int,_std::allocator<int>_> local_48;
  
  uVar24 = (ulong)(uint)count;
  local_b8 = bufferIndices;
  local_98 = categoryWeightsIndices;
  local_90 = stateFrequenciesIndices;
  std::vector<int,_std::allocator<int>_>::vector
            (&local_48,(long)(this->super_BeagleCPUImpl<double,_1,_0>).kPatternCount,
             (allocator_type *)&local_60);
  std::vector<double,_std::allocator<double>_>::vector
            (&local_60,(long)(this->super_BeagleCPUImpl<double,_1,_0>).kPatternCount,&local_b9);
  local_a0 = uVar24;
  if (0 < count) {
    local_80 = (ulong)(count - 1);
    uVar25 = 0;
    piVar21 = local_b8;
    do {
      local_88 = (long)piVar21[uVar25];
      pdVar14 = (this->super_BeagleCPUImpl<double,_1,_0>).gPartials[local_88];
      local_b0 = (this->super_BeagleCPUImpl<double,_1,_0>).gStateFrequencies[local_90[uVar25]];
      pdVar10 = (this->super_BeagleCPUImpl<double,_1,_0>).gCategoryWeights[local_98[uVar25]];
      iVar20 = (this->super_BeagleCPUImpl<double,_1,_0>).kPatternCount;
      uVar17 = 0;
      if (0 < iVar20) {
        dVar26 = *pdVar10;
        pdVar11 = (this->super_BeagleCPUImpl<double,_1,_0>).integrationTmp;
        uVar17 = 0;
        iVar18 = iVar20;
        do {
          pdVar11[uVar17] = dVar26 * pdVar14[uVar17];
          pdVar11[uVar17 + 1] = dVar26 * pdVar14[uVar17 + 1];
          pdVar11[uVar17 + 2] = dVar26 * pdVar14[uVar17 + 2];
          pdVar11[uVar17 + 3] = dVar26 * pdVar14[uVar17 + 3];
          uVar17 = uVar17 + 4;
          iVar18 = iVar18 + -1;
        } while (iVar18 != 0);
      }
      lVar19 = (long)(this->super_BeagleCPUImpl<double,_1,_0>).kCategoryCount;
      if (1 < lVar19) {
        pdVar11 = (this->super_BeagleCPUImpl<double,_1,_0>).integrationTmp;
        iVar18 = (this->super_BeagleCPUImpl<double,_1,_0>).kExtraPatterns;
        lVar22 = 1;
        do {
          iVar16 = (int)uVar17;
          if (0 < iVar20) {
            auVar27._8_8_ = 0;
            auVar27._0_8_ = pdVar10[lVar22];
            lVar23 = 0;
            iVar15 = iVar20;
            do {
              auVar32._8_8_ = 0;
              auVar32._0_8_ = pdVar14[iVar16 + lVar23];
              auVar2._8_8_ = 0;
              auVar2._0_8_ = pdVar11[lVar23];
              auVar2 = vfmadd213sd_fma(auVar32,auVar27,auVar2);
              pdVar11[lVar23] = auVar2._0_8_;
              auVar33._8_8_ = 0;
              auVar33._0_8_ = pdVar14[(long)iVar16 + lVar23 + 1];
              auVar3._8_8_ = 0;
              auVar3._0_8_ = pdVar11[lVar23 + 1];
              auVar2 = vfmadd213sd_fma(auVar33,auVar27,auVar3);
              pdVar11[lVar23 + 1] = auVar2._0_8_;
              auVar34._8_8_ = 0;
              auVar34._0_8_ = pdVar14[(long)iVar16 + lVar23 + 2];
              auVar4._8_8_ = 0;
              auVar4._0_8_ = pdVar11[lVar23 + 2];
              auVar2 = vfmadd213sd_fma(auVar34,auVar27,auVar4);
              pdVar11[lVar23 + 2] = auVar2._0_8_;
              auVar35._8_8_ = 0;
              auVar35._0_8_ = pdVar14[(long)iVar16 + lVar23 + 3];
              auVar5._8_8_ = 0;
              auVar5._0_8_ = pdVar11[lVar23 + 3];
              auVar2 = vfmadd213sd_fma(auVar35,auVar27,auVar5);
              pdVar11[lVar23 + 3] = auVar2._0_8_;
              lVar23 = lVar23 + 4;
              iVar15 = iVar15 + -1;
            } while (iVar15 != 0);
            iVar16 = iVar16 + (int)lVar23;
          }
          uVar17 = (ulong)(uint)(iVar16 + iVar18 * 4);
          lVar22 = lVar22 + 1;
        } while (lVar22 != lVar19);
      }
      piVar21 = local_b8;
      if (0 < (this->super_BeagleCPUImpl<double,_1,_0>).kPatternCount) {
        local_a8 = *local_b0;
        local_68 = local_b0[1];
        local_70 = local_b0[2];
        local_b0 = (double *)local_b0[3];
        lVar22 = 0;
        lVar19 = 0;
        do {
          pdVar14 = (this->super_BeagleCPUImpl<double,_1,_0>).integrationTmp;
          auVar28._8_8_ = 0;
          auVar28._0_8_ = local_a8;
          auVar6._8_8_ = 0;
          auVar6._0_8_ = pdVar14[lVar22];
          auVar37._8_8_ = 0;
          auVar37._0_8_ = local_68 * pdVar14[lVar22 + 1];
          auVar27 = vfmadd231sd_fma(auVar37,auVar28,auVar6);
          auVar29._8_8_ = 0;
          auVar29._0_8_ = local_70;
          auVar7._8_8_ = 0;
          auVar7._0_8_ = pdVar14[lVar22 + 2];
          auVar27 = vfmadd231sd_fma(auVar27,auVar29,auVar7);
          auVar30._8_8_ = 0;
          auVar30._0_8_ = local_b0;
          auVar8._8_8_ = 0;
          auVar8._0_8_ = pdVar14[lVar22 + 3];
          auVar27 = vfmadd231sd_fma(auVar27,auVar30,auVar8);
          dVar26 = auVar27._0_8_;
          if ((*scaleBufferIndices != -1) ||
             (((this->super_BeagleCPUImpl<double,_1,_0>).kFlags & 0x100) != 0)) {
            uVar13 = (uint)(this->super_BeagleCPUImpl<double,_1,_0>).kFlags;
            if ((uVar13 >> 8 & 1) == 0) {
              iVar20 = scaleBufferIndices[uVar25];
            }
            else {
              iVar20 = (int)local_88 - (this->super_BeagleCPUImpl<double,_1,_0>).kTipCount;
            }
            ppdVar12 = (this->super_BeagleCPUImpl<double,_1,_0>).gScaleBuffers;
            pdVar14 = ppdVar12[iVar20];
            if (uVar25 == 0) {
              local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start[lVar19] = 0;
              local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[lVar19] = pdVar14[lVar19];
              if ((int)local_a0 != 1) {
                auVar31 = ZEXT864((ulong)local_60.
                                         super__Vector_base<double,_std::allocator<double>_>._M_impl
                                         .super__Vector_impl_data._M_start[lVar19]);
                uVar17 = 1;
                do {
                  if ((uVar13 >> 8 & 1) == 0) {
                    iVar20 = scaleBufferIndices[uVar17];
                  }
                  else {
                    iVar20 = piVar21[uVar17] - (this->super_BeagleCPUImpl<double,_1,_0>).kTipCount;
                  }
                  dVar1 = ppdVar12[iVar20][lVar19];
                  if (auVar31._0_8_ < dVar1) {
                    local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar19] = (int)uVar17;
                    local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar19] = dVar1;
                    auVar31 = ZEXT864((ulong)dVar1);
                  }
                  uVar17 = uVar17 + 1;
                } while (uVar24 != uVar17);
              }
            }
            if (uVar25 != (uint)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start[lVar19]) {
              local_78 = dVar26;
              dVar26 = exp(pdVar14[lVar19] -
                           local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start[lVar19]);
              dVar26 = local_78 * dVar26;
              piVar21 = local_b8;
            }
          }
          if (uVar25 == 0) {
            (this->super_BeagleCPUImpl<double,_1,_0>).outLogLikelihoodsTmp[lVar19] = dVar26;
          }
          else {
            if (uVar25 == local_80) {
              dVar26 = log(dVar26 + (this->super_BeagleCPUImpl<double,_1,_0>).outLogLikelihoodsTmp
                                    [lVar19]);
              pdVar14 = (this->super_BeagleCPUImpl<double,_1,_0>).outLogLikelihoodsTmp;
              piVar21 = local_b8;
            }
            else {
              pdVar14 = (this->super_BeagleCPUImpl<double,_1,_0>).outLogLikelihoodsTmp;
              dVar26 = dVar26 + pdVar14[lVar19];
            }
            pdVar14[lVar19] = dVar26;
          }
          lVar22 = lVar22 + 4;
          lVar19 = lVar19 + 1;
        } while (lVar19 < (this->super_BeagleCPUImpl<double,_1,_0>).kPatternCount);
      }
      uVar25 = uVar25 + 1;
    } while (uVar25 != uVar24);
  }
  if (((*scaleBufferIndices != -1) ||
      (((this->super_BeagleCPUImpl<double,_1,_0>).kFlags & 0x100) != 0)) &&
     (lVar19 = (long)(this->super_BeagleCPUImpl<double,_1,_0>).kPatternCount, 0 < lVar19)) {
    pdVar14 = (this->super_BeagleCPUImpl<double,_1,_0>).outLogLikelihoodsTmp;
    lVar22 = 0;
    do {
      pdVar14[lVar22] =
           local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[lVar22] + pdVar14[lVar22];
      lVar22 = lVar22 + 1;
    } while (lVar19 != lVar22);
  }
  *outSumLogLikelihood = 0.0;
  lVar19 = (long)(this->super_BeagleCPUImpl<double,_1,_0>).kPatternCount;
  if (0 < lVar19) {
    pdVar14 = (this->super_BeagleCPUImpl<double,_1,_0>).gPatternWeights;
    pdVar10 = (this->super_BeagleCPUImpl<double,_1,_0>).outLogLikelihoodsTmp;
    auVar31 = ZEXT864((ulong)*outSumLogLikelihood);
    lVar22 = 0;
    do {
      auVar36._8_8_ = 0;
      auVar36._0_8_ = pdVar10[lVar22];
      auVar9._8_8_ = 0;
      auVar9._0_8_ = pdVar14[lVar22];
      auVar27 = vfmadd231sd_fma(auVar31._0_16_,auVar36,auVar9);
      auVar31 = ZEXT1664(auVar27);
      *outSumLogLikelihood = auVar27._0_8_;
      lVar22 = lVar22 + 1;
    } while (lVar19 != lVar22);
  }
  local_a8 = *outSumLogLikelihood;
  if (local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return (uint)(!NAN(local_a8) && !NAN(local_a8)) * 8 + -8;
}

Assistant:

BEAGLE_CPU_TEMPLATE
int BeagleCPU4StateImpl<BEAGLE_CPU_GENERIC>::calcRootLogLikelihoodsMulti(const int* bufferIndices,
                                                                const int* categoryWeightsIndices,
                                                                const int* stateFrequenciesIndices,
                                                                const int* scaleBufferIndices,
                                                                int count,
                                                                double* outSumLogLikelihood) {

    int returnCode = BEAGLE_SUCCESS;

    std::vector<int> indexMaxScale(kPatternCount);
    std::vector<REALTYPE> maxScaleFactor(kPatternCount);

    for (int subsetIndex = 0 ; subsetIndex < count; ++subsetIndex ) {
        const int rootPartialIndex = bufferIndices[subsetIndex];
        const REALTYPE* rootPartials = gPartials[rootPartialIndex];
        const REALTYPE* frequencies = gStateFrequencies[stateFrequenciesIndices[subsetIndex]];
        const REALTYPE* wt = gCategoryWeights[categoryWeightsIndices[subsetIndex]];
        int u = 0;
        int v = 0;

        const REALTYPE wt0 = wt[0];
        for (int k = 0; k < kPatternCount; k++) {
            integrationTmp[v    ] = rootPartials[v    ] * wt0;
            integrationTmp[v + 1] = rootPartials[v + 1] * wt0;
            integrationTmp[v + 2] = rootPartials[v + 2] * wt0;
            integrationTmp[v + 3] = rootPartials[v + 3] * wt0;
            v += 4;
        }
        for (int l = 1; l < kCategoryCount; l++) {
            u = 0;
            const REALTYPE wtl = wt[l];
            for (int k = 0; k < kPatternCount; k++) {
                integrationTmp[u    ] += rootPartials[v    ] * wtl;
                integrationTmp[u + 1] += rootPartials[v + 1] * wtl;
                integrationTmp[u + 2] += rootPartials[v + 2] * wtl;
                integrationTmp[u + 3] += rootPartials[v + 3] * wtl;

                u += 4;
                v += 4;
            }
            v += 4 * kExtraPatterns;
        }

        REALTYPE freq0, freq1, freq2, freq3;
        freq0 = frequencies[0];
        freq1 = frequencies[1];
        freq2 = frequencies[2];
        freq3 = frequencies[3];

        u = 0;
        for (int k = 0; k < kPatternCount; k++) {
            REALTYPE sum =
                freq0 * integrationTmp[u    ] +
                freq1 * integrationTmp[u + 1] +
                freq2 * integrationTmp[u + 2] +
                freq3 * integrationTmp[u + 3];

            u += 4;

            // TODO: allow only some subsets to have scale indices
            if (scaleBufferIndices[0] != BEAGLE_OP_NONE || (kFlags & BEAGLE_FLAG_SCALING_ALWAYS)) {
                int cumulativeScalingFactorIndex;
                if (kFlags & BEAGLE_FLAG_SCALING_ALWAYS)
                    cumulativeScalingFactorIndex = rootPartialIndex - kTipCount;
                else
                    cumulativeScalingFactorIndex = scaleBufferIndices[subsetIndex];

                const REALTYPE* cumulativeScaleFactors = gScaleBuffers[cumulativeScalingFactorIndex];

                if (subsetIndex == 0) {
                    indexMaxScale[k] = 0;
                    maxScaleFactor[k] = cumulativeScaleFactors[k];
                    for (int j = 1; j < count; j++) {
                        REALTYPE tmpScaleFactor;
                        if (kFlags & BEAGLE_FLAG_SCALING_ALWAYS)
                            tmpScaleFactor = gScaleBuffers[bufferIndices[j] - kTipCount][k];
                        else
                            tmpScaleFactor = gScaleBuffers[scaleBufferIndices[j]][k];

                        if (tmpScaleFactor > maxScaleFactor[k]) {
                            indexMaxScale[k] = j;
                            maxScaleFactor[k] = tmpScaleFactor;
                        }
                    }
                }

                if (subsetIndex != indexMaxScale[k])
                    sum *= exp((REALTYPE)(cumulativeScaleFactors[k] - maxScaleFactor[k]));
            }

            if (subsetIndex == 0) {
                outLogLikelihoodsTmp[k] = sum;
            } else if (subsetIndex == count - 1) {
                REALTYPE tmpSum = outLogLikelihoodsTmp[k] + sum;

                outLogLikelihoodsTmp[k] = log(tmpSum);
            } else {
                outLogLikelihoodsTmp[k] += sum;
            }
        }
    }

    if (scaleBufferIndices[0] != BEAGLE_OP_NONE || (kFlags & BEAGLE_FLAG_SCALING_ALWAYS)) {
        for(int i=0; i<kPatternCount; i++)
            outLogLikelihoodsTmp[i] += maxScaleFactor[i];
    }

    *outSumLogLikelihood = 0.0;
    for (int i = 0; i < kPatternCount; i++) {
        *outSumLogLikelihood += outLogLikelihoodsTmp[i] * gPatternWeights[i];
    }

    if (*outSumLogLikelihood != *outSumLogLikelihood)
        returnCode = BEAGLE_ERROR_FLOATING_POINT;

    return returnCode;
}